

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O1

size_t lws_ring_consume(lws_ring *ring,uint32_t *tail,void *dest,size_t max_count)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *__dest;
  uint *puVar8;
  uint32_t fake_tail;
  int local_40;
  uint32_t local_34;
  
  puVar8 = tail;
  if (tail == (uint32_t *)0x0) {
    puVar8 = &local_34;
    local_34 = ring->oldest_tail;
  }
  uVar2 = ring->head;
  uVar1 = *puVar8;
  uVar3 = 0;
  if (uVar2 != uVar1) {
    if (uVar1 < uVar2) {
      uVar2 = uVar2 - uVar1;
    }
    else {
      uVar2 = (uVar2 - uVar1) + ring->buflen;
    }
    uVar3 = (ulong)uVar2;
  }
  uVar2 = ring->buflen;
  uVar4 = (int)uVar3 - (int)(uVar3 % (ulong)ring->element_len);
  uVar3 = max_count * ring->element_len;
  uVar7 = (ulong)uVar4;
  if (uVar3 < (ulong)(long)(int)uVar4) {
    uVar7 = uVar3 & 0xffffffff;
  }
  iVar6 = (int)uVar7;
  if (dest == (void *)0x0) {
    uVar2 = (iVar6 + uVar1) % uVar2;
    *puVar8 = uVar2;
    if (tail == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail(ring,uVar2);
    }
  }
  else {
    __dest = dest;
    if (uVar2 < iVar6 + uVar1) {
      iVar5 = uVar2 - uVar1;
      memcpy(dest,(void *)((ulong)uVar1 + (long)ring->buf),(long)iVar5);
      *puVar8 = 0;
      __dest = (void *)((long)dest + (long)iVar5);
      iVar6 = iVar6 - iVar5;
    }
    memcpy(__dest,(void *)((ulong)*puVar8 + (long)ring->buf),(long)iVar6);
    uVar2 = (iVar6 + *puVar8) % ring->buflen;
    *puVar8 = uVar2;
    if (tail == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail(ring,uVar2);
    }
    local_40 = (int)dest;
    uVar7 = (ulong)(uint)(((int)__dest + iVar6) - local_40);
  }
  return uVar7 / ring->element_len;
}

Assistant:

size_t
lws_ring_consume(struct lws_ring *ring, uint32_t *tail, void *dest,
		 size_t max_count)
{
	uint8_t *odest = dest;
	void *orig_tail = tail;
	uint32_t fake_tail;
	int m, n;

	if (!tail) {
		fake_tail = ring->oldest_tail;
		tail = &fake_tail;
	}

	/* n is how many bytes the whole fifo has for us */
	n = (int)(lws_ring_get_count_waiting_elements(ring, tail) *
							ring->element_len);

	/* restrict n to how much we want to insert */
	if ((size_t)n > max_count * ring->element_len)
		n = (int)(max_count * ring->element_len);

	if (!dest) {
		*tail = ((*tail) + (unsigned int)n) % ring->buflen;
		if (!orig_tail) /* single tail */
			lws_ring_update_oldest_tail(ring, *tail);

		return (unsigned int)n / ring->element_len;
	}
	if (*tail + (unsigned int)n > ring->buflen) {

		/*
		 * He does wrap.  The first memcpy should take us up to
		 * the end of the buffer
		 */

		m = (int32_t)(ring->buflen - *tail);
		memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)m);
		/* we know it will wrap exactly back to zero */
		*tail = 0;

		/* adapt the second memcpy for what we already did */

		dest = ((uint8_t *)dest) + m;
		n -= m;
	}

	memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)n);

	*tail = ((*tail) + (unsigned int)n) % ring->buflen;
	if (!orig_tail) /* single tail */
		lws_ring_update_oldest_tail(ring, *tail);

	return (unsigned int)(((uint8_t *)dest + n) - odest) / (unsigned int)ring->element_len;
}